

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O2

Name __thiscall
wasm::Asyncify::createSecondaryMemory(Asyncify *this,Module *module,Address secondaryMemorySize)

{
  IString IVar1;
  Name name;
  string_view local_48;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> local_38;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> secondaryMemory;
  
  Name::Name((Name *)&local_48,"asyncify_memory");
  IVar1.str = (string_view)Names::getValidMemoryName(module,local_48);
  name.super_IString.str._M_str = (char *)IVar1.str._M_len;
  name.super_IString.str._M_len = (size_t)&local_38;
  Builder::makeMemory(name,(Address)IVar1.str._M_str,secondaryMemorySize,
                      SUB81(secondaryMemorySize.addr,0),(Type)0x0);
  Module::addMemory(module,&local_38);
  std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::~unique_ptr(&local_38);
  return (IString)(IString)IVar1.str;
}

Assistant:

Name createSecondaryMemory(Module* module, Address secondaryMemorySize) {
    Name name = Names::getValidMemoryName(*module, "asyncify_memory");
    auto secondaryMemory =
      Builder::makeMemory(name, secondaryMemorySize, secondaryMemorySize);
    module->addMemory(std::move(secondaryMemory));
    return name;
  }